

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O3

bool __thiscall
Memory::PreReservedVirtualAllocWrapper::IsInRange
          (PreReservedVirtualAllocWrapper *this,void *address)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  SIZE_T SVar5;
  undefined4 *puVar6;
  undefined1 local_48 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  
  pvVar1 = this->preReservedStartAddress;
  if (((pvVar1 <= address && pvVar1 != (void *)0x0) &&
      (uVar4 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data),
      address < (void *)((long)pvVar1 + (ulong)(uVar4 << 0x18)))) &&
     (SVar5 = VirtualQuery(address,(PMEMORY_BASIC_INFORMATION)local_48,0x30), SVar5 != 0)) {
    if ((int)memBasicInfo.RegionSize != 0x1000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x97,"(memBasicInfo.State == 0x1000)",
                         "Memory not committed? Checking for uncommitted address region?");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool
PreReservedVirtualAllocWrapper::IsInRange(void * address)
{
    if (!this->IsPreReservedRegionPresent())
    {
        return false;
    }
    bool isInRange = IsInRange(GetPreReservedStartAddress(), address);
#if DBG
    if (isInRange)
    {
        //Check if the region is in MEM_COMMIT state.
        MEMORY_BASIC_INFORMATION memBasicInfo;
        size_t bytes = VirtualQuery(address, &memBasicInfo, sizeof(memBasicInfo));
        if (bytes == 0)
        {
            return false;
        }
        AssertMsg(memBasicInfo.State == MEM_COMMIT, "Memory not committed? Checking for uncommitted address region?");
    }
#endif
    return isInRange;
}